

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_thread_identity.cc
# Opt level: O2

void absl::lts_20250127::synchronization_internal::ReclaimThreadIdentity(void *v)

{
  SpinLockHolder l;
  SpinLockHolder local_18;
  
  if (*(void **)((long)v + 0x38) != (void *)0x0) {
    base_internal::LowLevelAlloc::Free(*(void **)((long)v + 0x38));
  }
  base_internal::ClearCurrentThreadIdentity();
  local_18.lock_ = (SpinLock *)&freelist_lock;
  base_internal::SpinLock::Lock((SpinLock *)&freelist_lock);
  *(void **)((long)v + 0x158) = thread_identity_freelist;
  thread_identity_freelist = v;
  base_internal::SpinLockHolder::~SpinLockHolder(&local_18);
  return;
}

Assistant:

static void ReclaimThreadIdentity(void* v) {
  base_internal::ThreadIdentity* identity =
      static_cast<base_internal::ThreadIdentity*>(v);

  // all_locks might have been allocated by the Mutex implementation.
  // We free it here when we are notified that our thread is dying.
  if (identity->per_thread_synch.all_locks != nullptr) {
    base_internal::LowLevelAlloc::Free(identity->per_thread_synch.all_locks);
  }

  // We must explicitly clear the current thread's identity:
  // (a) Subsequent (unrelated) per-thread destructors may require an identity.
  //     We must guarantee a new identity is used in this case (this instructor
  //     will be reinvoked up to PTHREAD_DESTRUCTOR_ITERATIONS in this case).
  // (b) ThreadIdentity implementations may depend on memory that is not
  //     reinitialized before reuse.  We must allow explicit clearing of the
  //     association state in this case.
  base_internal::ClearCurrentThreadIdentity();
  {
    base_internal::SpinLockHolder l(&freelist_lock);
    identity->next = thread_identity_freelist;
    thread_identity_freelist = identity;
  }
}